

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte bVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  xmlParserInputBufferPtr pxVar4;
  int iVar5;
  xmlCharEncodingHandlerPtr handler;
  byte *pbVar6;
  int val;
  xmlParserInputBufferPtr in_RCX;
  xmlChar *pxVar7;
  long lVar8;
  xmlChar *pxVar9;
  char buffer [150];
  xmlChar local_c8 [160];
  
  val = (int)in_RCX;
  if (ctxt->instate == XML_PARSER_EOF) {
    return 0;
  }
  if (ctxt->token != 0) {
    *len = 0;
    return ctxt->token;
  }
  if (ctxt->charset == 1) goto LAB_0014f860;
  pxVar3 = ctxt->input;
  pbVar6 = pxVar3->cur;
  bVar1 = *pbVar6;
  if ((char)bVar1 < '\0') {
    if ((((((pxVar3 == (xmlParserInputPtr)0x0) || (pxVar3->encoding != (xmlChar *)0x0)) ||
          (in_RCX = pxVar3->buf, in_RCX == (xmlParserInputBufferPtr)0x0)) ||
         ((in_RCX->encoder != (xmlCharEncodingHandlerPtr)0x0 || (pxVar3->end == (xmlChar *)0x0))))
        || ((*pxVar3->end != '\0' ||
            ((pxVar9 = xmlStrcasestr(pbVar6,(xmlChar *)"HTTP-EQUIV"), pxVar9 == (xmlChar *)0x0 ||
             (pxVar9 = xmlStrcasestr(pxVar9,(xmlChar *)"CONTENT"), pxVar9 == (xmlChar *)0x0)))))) ||
       (pxVar9 = xmlStrcasestr(pxVar9,(xmlChar *)"CHARSET="), pxVar9 == (xmlChar *)0x0)) {
LAB_0014f70d:
      val = (int)in_RCX;
      pxVar9 = (xmlChar *)0x0;
    }
    else {
      lVar8 = 0;
      in_RCX = (xmlParserInputBufferPtr)0x4000000002005;
      val = 0x2005;
      while (((bVar2 = pxVar9[lVar8 + 8], (byte)(bVar2 - 0x30) < 10 ||
              ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
             ((bVar2 - 0x2d < 0x33 &&
              ((0x4000000002005U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))))) {
        lVar8 = lVar8 + 1;
      }
      if (lVar8 == 0) goto LAB_0014f70d;
      pxVar9 = xmlStrndup(pxVar9 + 8,(int)lVar8);
    }
    if (pxVar9 == (xmlChar *)0x0) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
    }
    else {
      pxVar7 = ctxt->input->encoding;
      if (pxVar7 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar7);
      }
      ctxt->input->encoding = pxVar9;
      handler = xmlFindCharEncodingHandler((char *)pxVar9);
      if (handler == (xmlCharEncodingHandlerPtr)0x0) {
        pxVar7 = pxVar9;
        htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Unsupported encoding %s",pxVar9,(xmlChar *)0x0);
        val = (int)pxVar7;
      }
      else {
        iVar5 = xmlStrEqual((xmlChar *)handler->name,"UTF-8");
        if (iVar5 == 0) {
          xmlSwitchToEncoding(ctxt,handler);
        }
      }
    }
    ctxt->charset = 1;
  }
  else {
    *len = 1;
    pxVar9 = (xmlChar *)(ulong)*pbVar6;
    if ((*pbVar6 == 0) && (pbVar6 < pxVar3->end)) {
      htmlParseErrInt(ctxt,0x1f03c2,(char *)0x0,val);
      pxVar9 = (xmlChar *)0x20;
    }
  }
  if (-1 < (char)bVar1) {
    return (int)pxVar9;
  }
LAB_0014f860:
  pxVar3 = ctxt->input;
  pbVar6 = pxVar3->cur;
  bVar1 = *pbVar6;
  if ((char)bVar1 < '\0') {
    if (((bVar1 & 0x40) != 0) && (pbVar6[1] == 0)) {
      xmlParserInputGrow(pxVar3,0xfa);
    }
    pbVar6 = ctxt->input->cur;
    if ((long)ctxt->input->end - (long)pbVar6 < 4) {
      snprintf((char *)local_c8,0x95,"Bytes: 0x%02X\n",(ulong)*pbVar6);
    }
    else {
      snprintf((char *)local_c8,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*pbVar6,
               (ulong)pbVar6[1],(ulong)pbVar6[2],(uint)pbVar6[3]);
    }
    htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Input is not proper UTF-8, indicate encoding !\n",
                 local_c8,(xmlChar *)0x0);
    pxVar4 = ctxt->input->buf;
    if ((pxVar4 != (xmlParserInputBufferPtr)0x0) &&
       (pxVar4->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
    }
    *len = 1;
    pbVar6 = ctxt->input->cur;
  }
  else {
    if ((bVar1 == 0) && (pbVar6 < pxVar3->end)) {
      htmlParseErrInt(ctxt,0x1f03c2,(char *)0x0,val);
      *len = 1;
      return 0x20;
    }
    *len = 1;
  }
  return (uint)*pbVar6;
}

Assistant:

static int
htmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    unsigned char c;
    unsigned int val;

    if (ctxt->instate == XML_PARSER_EOF)
	return(0);

    if (ctxt->token != 0) {
	*len = 0;
	return(ctxt->token);
    }
    if (ctxt->charset != XML_CHAR_ENCODING_UTF8) {
        xmlChar * guess;
        xmlCharEncodingHandlerPtr handler;

        /*
         * Assume it's a fixed length encoding (1) with
         * a compatible encoding for the ASCII set, since
         * HTML constructs only use < 128 chars
         */
        if (*ctxt->input->cur < 0x80) {
            *len = 1;
            if ((*ctxt->input->cur == 0) &&
                (ctxt->input->cur < ctxt->input->end)) {
                htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                "Char 0x%X out of allowed range\n", 0);
                return(' ');
            }
            return(*ctxt->input->cur);
        }

        /*
         * Humm this is bad, do an automatic flow conversion
         */
        guess = htmlFindEncoding(ctxt);
        if (guess == NULL) {
            xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
        } else {
            if (ctxt->input->encoding != NULL)
                xmlFree((xmlChar *) ctxt->input->encoding);
            ctxt->input->encoding = guess;
            handler = xmlFindCharEncodingHandler((const char *) guess);
            if (handler != NULL) {
                /*
                 * Don't use UTF-8 encoder which isn't required and
                 * can produce invalid UTF-8.
                 */
                if (!xmlStrEqual(BAD_CAST handler->name, BAD_CAST "UTF-8"))
                    xmlSwitchToEncoding(ctxt, handler);
            } else {
                htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
                             "Unsupported encoding %s", guess, NULL);
            }
        }
        ctxt->charset = XML_CHAR_ENCODING_UTF8;
    }

    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     *
     * Check for the 0x110000 limit too
     */
    cur = ctxt->input->cur;
    c = *cur;
    if (c & 0x80) {
        if ((c & 0x40) == 0)
            goto encoding_error;
        if (cur[1] == 0) {
            xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
            cur = ctxt->input->cur;
        }
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;
        if ((c & 0xe0) == 0xe0) {

            if (cur[2] == 0) {
                xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;
            if ((c & 0xf0) == 0xf0) {
                if (cur[3] == 0) {
                    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
                if (((c & 0xf8) != 0xf0) ||
                    ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;
                /* 4-byte code */
                *len = 4;
                val = (cur[0] & 0x7) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if (val < 0x10000)
                    goto encoding_error;
            } else {
              /* 3-byte code */
                *len = 3;
                val = (cur[0] & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if (val < 0x800)
                    goto encoding_error;
            }
        } else {
          /* 2-byte code */
            *len = 2;
            val = (cur[0] & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            if (val < 0x80)
                goto encoding_error;
        }
        if (!IS_CHAR(val)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", val);
        }
        return(val);
    } else {
        if ((*ctxt->input->cur == 0) &&
            (ctxt->input->cur < ctxt->input->end)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", 0);
            *len = 1;
            return(' ');
        }
        /* 1-byte code */
        *len = 1;
        return(*ctxt->input->cur);
    }

encoding_error:
    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    {
        char buffer[150];

	if (ctxt->input->end - ctxt->input->cur >= 4) {
	    snprintf(buffer, 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			    ctxt->input->cur[0], ctxt->input->cur[1],
			    ctxt->input->cur[2], ctxt->input->cur[3]);
	} else {
	    snprintf(buffer, 149, "Bytes: 0x%02X\n", ctxt->input->cur[0]);
	}
	htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
		     "Input is not proper UTF-8, indicate encoding !\n",
		     BAD_CAST buffer, NULL);
    }

    /*
     * Don't switch encodings twice. Note that if there's an encoder, we
     * shouldn't receive invalid UTF-8 anyway.
     *
     * Note that if ctxt->input->buf == NULL, switching encodings is
     * impossible, see Gitlab issue #34.
     */
    if ((ctxt->input->buf != NULL) &&
        (ctxt->input->buf->encoder == NULL))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
    *len = 1;
    return(*ctxt->input->cur);
}